

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool kwssys::SystemTools::IsSubDirectory(string *cSubdir,string *cDir)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  string *c1;
  string *in_RSI;
  string *in_RDI;
  size_t expectedSlashPosition;
  bool isRootPath;
  string dir;
  string subdir;
  string *in_stack_ffffffffffffff68;
  string local_58 [32];
  string local_38 [32];
  string *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string(local_38,(string *)in_RDI);
    std::__cxx11::string::string(local_58,local_18);
    ConvertToUnixSlashes(in_RDI);
    ConvertToUnixSlashes(in_RDI);
    uVar1 = std::__cxx11::string::size();
    uVar2 = std::__cxx11::string::size();
    if ((uVar2 < uVar1) && (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) == 0)) {
      pcVar3 = (char *)std::__cxx11::string::back();
      if (*pcVar3 == '/') {
        std::__cxx11::string::size();
      }
      else {
        std::__cxx11::string::size();
      }
      c1 = (string *)std::__cxx11::string::operator[]((ulong)local_38);
      if (c1->_M_dataplus == (_Alloc_hider)0x2f) {
        std::__cxx11::string::size();
        std::__cxx11::string::resize((ulong)local_38);
        local_1 = ComparePath(c1,in_stack_ffffffffffffff68);
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_38);
    return local_1;
  }
  return false;
}

Assistant:

bool SystemTools::IsSubDirectory(const std::string& cSubdir,
                                 const std::string& cDir)
{
  if (cDir.empty()) {
    return false;
  }
  std::string subdir = cSubdir;
  std::string dir = cDir;
  SystemTools::ConvertToUnixSlashes(subdir);
  SystemTools::ConvertToUnixSlashes(dir);
  if (subdir.size() <= dir.size() || dir.empty()) {
    return false;
  }
  bool isRootPath = dir.back() == '/'; // like "/" or "C:/"
  size_t expectedSlashPosition = isRootPath ? dir.size() - 1u : dir.size();
  if (subdir[expectedSlashPosition] != '/') {
    return false;
  }
  subdir.resize(dir.size());
  return SystemTools::ComparePath(subdir, dir);
}